

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::
FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
::doApply(IRet *__return_storage_ptr__,
         FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
         *this,EvalContext *ctx,IArgs *iargs)

{
  IArg1 *arg1;
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  IArgs *ctx_00;
  Interval *pIVar1;
  Void *arg2;
  Void *arg3;
  IRet local_50;
  int local_34;
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pFStack_30;
  int ndx;
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
  *this_local;
  IRet *ret;
  
  func = (Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)iargs;
  iargs_local = (IArgs *)ctx;
  ctx_local = (EvalContext *)this;
  this_local = (FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
                *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  pFStack_30 = (Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)(**(code **)(*(long *)this + 0x58))();
  for (local_34 = 0; ctx_00 = iargs_local, this_00 = pFStack_30, local_34 < 3;
      local_34 = local_34 + 1) {
    pIVar1 = tcu::Vector<tcu::Interval,_3>::operator[]
                       ((Vector<tcu::Interval,_3> *)(func->super_FuncBase)._vptr_FuncBase,local_34);
    arg1 = (IArg1 *)func[1].super_FuncBase._vptr_FuncBase;
    arg2 = Void::operator[]((Void *)func[2].super_FuncBase._vptr_FuncBase,local_34);
    arg3 = Void::operator[]((Void *)func[3].super_FuncBase._vptr_FuncBase,local_34);
    Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::apply(&local_50,this_00,(EvalContext *)ctx_00,pIVar1,arg1,arg2,arg3);
    pIVar1 = tcu::Vector<tcu::Interval,_3>::operator[](__return_storage_ptr__,local_34);
    pIVar1->m_hasNaN = local_50.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_50._1_7_;
    pIVar1->m_lo = local_50.m_lo;
    pIVar1->m_hi = local_50.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext& ctx,
												 const IArgs&		iargs) const
	{
		IRet				ret;
		const Func<Sig_>&	func	= this->doGetScalarFunc();

		for (int ndx = 0; ndx < Size; ++ndx)
			ret[ndx] = func.apply(ctx, iargs.a[ndx], iargs.b, iargs.c[ndx], iargs.d[ndx]);

		return ret;
	}